

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O2

NameSyntax *
slang::ast::anon_unknown_39::splitScopedName
          (ScopedNameSyntax *syntax,
          SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc> *nameParts,int *colonParts
          )

{
  ulong uVar1;
  long lVar2;
  int iVar3;
  pointer pNVar4;
  NamePlusLoc *pNVar5;
  long lVar6;
  pointer pNVar7;
  ulong uVar8;
  NamePlusLoc *pNVar9;
  NamePlusLoc *pNVar10;
  NamePlusLoc *pNVar11;
  NamePlusLoc *pNVar12;
  pointer pNVar13;
  byte bVar14;
  NamePlusLoc local_78;
  
  bVar14 = 0;
  lVar2 = 9;
  do {
    pNVar12 = &local_78;
    NameComponents::NameComponents(&pNVar12->name,(syntax->right).ptr);
    local_78.dotLocation = parsing::Token::location(&syntax->separator);
    local_78.kind = (((syntax->right).ptr)->super_ExpressionSyntax).super_SyntaxNode.kind;
    uVar1 = nameParts->len;
    pNVar9 = nameParts->data_ + uVar1;
    lVar6 = lVar2;
    if (uVar1 == nameParts->cap) {
      if (-uVar1 == -0x1c71c71c71c71c7) {
        slang::detail::throwLengthError();
      }
      uVar8 = uVar1 + 1;
      if (uVar1 + 1 < uVar1 * 2) {
        uVar8 = uVar1 * 2;
      }
      if (-uVar1 + 0x1c71c71c71c71c7 < uVar1) {
        uVar8 = 0x1c71c71c71c71c7;
      }
      pNVar4 = (pointer)operator_new(uVar8 * 0x48);
      pNVar12 = &local_78;
      pNVar7 = pNVar4 + uVar1;
      for (; lVar6 != 0; lVar6 = lVar6 + -1) {
        (pNVar7->name).text._M_len = (pNVar12->name).text._M_len;
        pNVar12 = (NamePlusLoc *)((long)pNVar12 + (ulong)bVar14 * -0x10 + 8);
        pNVar7 = (pointer)((long)pNVar7 + ((ulong)bVar14 * -2 + 1) * 8);
      }
      pNVar5 = nameParts->data_;
      pNVar11 = pNVar5 + nameParts->len;
      pNVar7 = pNVar4;
      if (pNVar11 == pNVar9) {
        for (; lVar6 = lVar2, pNVar11 = pNVar5, pNVar13 = pNVar7, pNVar5 != pNVar9;
            pNVar5 = pNVar5 + 1) {
          for (; lVar6 != 0; lVar6 = lVar6 + -1) {
            (pNVar13->name).text._M_len = (pNVar11->name).text._M_len;
            pNVar11 = (NamePlusLoc *)((long)pNVar11 + (ulong)bVar14 * -0x10 + 8);
            pNVar13 = (pointer)((long)pNVar13 + ((ulong)bVar14 * -2 + 1) * 8);
          }
          pNVar7 = pNVar7 + 1;
          pNVar12 = pNVar11;
        }
      }
      else {
        for (; lVar6 = lVar2, pNVar10 = pNVar5, pNVar13 = pNVar7, pNVar5 != pNVar9;
            pNVar5 = pNVar5 + 1) {
          for (; lVar6 != 0; lVar6 = lVar6 + -1) {
            (pNVar13->name).text._M_len = (pNVar10->name).text._M_len;
            pNVar10 = (NamePlusLoc *)((long)pNVar10 + (ulong)bVar14 * -0x10 + 8);
            pNVar13 = (pointer)((long)pNVar13 + ((ulong)bVar14 * -2 + 1) * 8);
          }
          pNVar7 = pNVar7 + 1;
          pNVar12 = pNVar10;
        }
        pNVar7 = pNVar4 + uVar1;
        for (; pNVar7 = pNVar7 + 1, lVar6 = lVar2, pNVar5 = pNVar9, pNVar13 = pNVar7,
            pNVar9 != pNVar11; pNVar9 = pNVar9 + 1) {
          for (; lVar6 != 0; lVar6 = lVar6 + -1) {
            (pNVar13->name).text._M_len = (pNVar5->name).text._M_len;
            pNVar5 = (NamePlusLoc *)((long)pNVar5 + (ulong)bVar14 * -0x10 + 8);
            pNVar13 = (pointer)((long)pNVar13 + ((ulong)bVar14 * -2 + 1) * 8);
          }
          pNVar12 = pNVar5;
        }
      }
      SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>::cleanup
                (nameParts,(EVP_PKEY_CTX *)pNVar12);
      nameParts->len = nameParts->len + 1;
      nameParts->cap = uVar8;
      nameParts->data_ = pNVar4;
    }
    else {
      for (; lVar6 != 0; lVar6 = lVar6 + -1) {
        (pNVar9->name).text._M_len = (pNVar12->name).text._M_len;
        pNVar12 = (NamePlusLoc *)((long)pNVar12 + (ulong)bVar14 * -0x10 + 8);
        pNVar9 = (NamePlusLoc *)((long)pNVar9 + (ulong)bVar14 * -0x10 + 8);
      }
      nameParts->len = nameParts->len + 1;
    }
    iVar3 = *colonParts + 1;
    if ((syntax->separator).kind == Dot) {
      iVar3 = 0;
    }
    *colonParts = iVar3;
    syntax = (ScopedNameSyntax *)(syntax->left).ptr;
  } while ((syntax->super_NameSyntax).super_ExpressionSyntax.super_SyntaxNode.kind == ScopedName);
  return &syntax->super_NameSyntax;
}

Assistant:

const NameSyntax* splitScopedName(const ScopedNameSyntax& syntax,
                                  SmallVectorBase<NamePlusLoc>& nameParts, int& colonParts) {
    // Split the name into easier to manage chunks. The parser will always produce a
    // left-recursive name tree, so that's all we'll bother to handle.
    const ScopedNameSyntax* scoped = &syntax;
    while (true) {
        nameParts.push_back({*scoped->right, scoped->separator.location(), scoped->right->kind});
        if (scoped->separator.kind == TokenKind::Dot)
            colonParts = 0;
        else
            colonParts++;

        if (scoped->left->kind != SyntaxKind::ScopedName)
            break;

        scoped = &scoped->left->as<ScopedNameSyntax>();
    }
    return scoped->left;
}